

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O3

string * __thiscall
CLI::ConfigBase::to_config
          (string *__return_storage_ptr__,ConfigBase *this,App *app,bool default_also,
          bool write_description,string *prefix)

{
  pointer pcVar1;
  Option *this_00;
  size_t __n;
  size_type sVar2;
  App *subcom;
  App *pAVar3;
  pointer ppOVar4;
  pointer ppOVar5;
  size_type sVar6;
  pointer ppOVar7;
  string *psVar8;
  byte bVar9;
  int iVar10;
  ostream *poVar11;
  App *pAVar12;
  long *plVar13;
  undefined7 in_register_00000009;
  long *plVar14;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar16;
  _Alloc_hider _Var17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined7 in_register_00000081;
  byte bVar20;
  pointer pbVar21;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar22;
  bool bVar23;
  string name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  string value;
  string commentLead;
  vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_> subcommands;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  groups;
  stringstream out;
  _Any_data local_368;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_358;
  byte local_341;
  uint local_340;
  undefined4 local_33c;
  undefined1 local_338 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_318;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_308;
  App *local_2f8;
  undefined8 local_2f0;
  string local_2e8;
  string *local_2c8;
  ConfigBase *local_2c0;
  string local_2b8;
  long *local_298;
  long local_290;
  long local_288;
  undefined4 uStack_280;
  undefined4 uStack_27c;
  vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> local_278;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_260;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_248 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_238;
  string local_228;
  string *local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_200;
  _Any_data local_1f8;
  code *local_1e8;
  undefined8 uStack_1e0;
  long *local_1d8 [2];
  long local_1c8 [2];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  local_33c = (undefined4)CONCAT71(in_register_00000081,write_description);
  local_340 = (uint)CONCAT71(in_register_00000009,default_also);
  local_2f8 = app;
  local_2c8 = prefix;
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
  local_2e8._M_string_length = 0;
  local_2e8.field_2._M_local_buf[0] = '\0';
  local_2c0 = this;
  ::std::__cxx11::string::push_back((char)&local_2e8);
  ::std::__cxx11::string::push_back((char)&local_2e8);
  App::get_groups_abi_cxx11_(&local_260,local_2f8);
  pbVar21 = local_260.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_368._M_unused._M_object = &local_358;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_368,"Options","");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_insert_rval(&local_260,(const_iterator)pbVar21,(value_type *)&local_368);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368._M_unused._0_8_ != &local_358) {
    operator_delete(local_368._M_unused._M_object,local_358._M_allocated_capacity + 1);
  }
  if ((char)local_33c != '\0') {
    poVar11 = ::std::__ostream_insert<char,std::char_traits<char>>
                        (local_1a8,local_2e8._M_dataplus._M_p,local_2e8._M_string_length);
    pcVar1 = (local_2f8->description_)._M_dataplus._M_p;
    local_368._M_unused._M_object = &local_358;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_368,pcVar1,pcVar1 + (local_2f8->description_)._M_string_length);
    poVar11 = ::std::__ostream_insert<char,std::char_traits<char>>
                        (poVar11,(char *)local_368._M_unused._0_8_,local_368._8_8_);
    local_318._M_local_buf[0] = 10;
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar11,local_318._M_local_buf,1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_368._M_unused._0_8_ != &local_358) {
      operator_delete(local_368._M_unused._M_object,local_358._M_allocated_capacity + 1);
    }
  }
  local_208 = __return_storage_ptr__;
  if (local_260.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_260.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_200 = local_260.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    pbVar16 = local_260.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pbVar22 = local_260.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    bVar20 = 0;
    do {
      iVar10 = ::std::__cxx11::string::compare((char *)pbVar16);
      if (iVar10 == 0) {
        bVar9 = 1;
        if ((bVar20 & 1) == 0) goto LAB_0010df7c;
      }
      else {
        bVar23 = pbVar16->_M_string_length == 0;
        bVar9 = 1;
        if ((bVar23 & bVar20) == 0) {
          bVar9 = bVar23 | bVar20;
LAB_0010df7c:
          if ((((char)local_33c != '\0') &&
              (iVar10 = ::std::__cxx11::string::compare((char *)pbVar16), iVar10 != 0)) &&
             (pbVar16->_M_string_length != 0)) {
            local_368._M_pod_data[0] = 10;
            poVar11 = ::std::__ostream_insert<char,std::char_traits<char>>
                                (local_1a8,local_368._M_pod_data,1);
            poVar11 = ::std::__ostream_insert<char,std::char_traits<char>>
                                (poVar11,local_2e8._M_dataplus._M_p,local_2e8._M_string_length);
            poVar11 = ::std::__ostream_insert<char,std::char_traits<char>>
                                (poVar11,(pbVar16->_M_dataplus)._M_p,pbVar16->_M_string_length);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar11," Options\n",9);
          }
          local_1f8._M_unused._M_object = (void *)0x0;
          local_1f8._8_8_ = 0;
          local_1e8 = (code *)0x0;
          uStack_1e0 = 0;
          App::get_options(&local_278,local_2f8,(function<bool_(const_CLI::Option_*)> *)&local_1f8);
          pbVar22 = pbVar16;
          local_341 = bVar9;
          ppOVar4 = local_278.
                    super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          ppOVar5 = local_278.
                    super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
          if (local_1e8 != (code *)0x0) {
            (*local_1e8)(&local_1f8,&local_1f8,__destroy_functor);
            ppOVar4 = local_278.
                      super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            ppOVar5 = local_278.
                      super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
          }
          for (; local_2f0 = pbVar22,
              ppOVar7 = local_278.
                        super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish,
              ppOVar4 !=
              local_278.
              super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>._M_impl.
              super__Vector_impl_data._M_finish; ppOVar4 = ppOVar4 + 1) {
            this_00 = *ppOVar4;
            pbVar21 = (this_00->lnames_).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            local_278.super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>.
            _M_impl.super__Vector_impl_data._M_finish = ppOVar5;
            if ((pbVar21 !=
                 (this_00->lnames_).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish) &&
               ((this_00->super_OptionBase<CLI::Option>).configurable_ == true)) {
              __n = (this_00->super_OptionBase<CLI::Option>).group_._M_string_length;
              if ((__n != pbVar16->_M_string_length) ||
                 ((__n != 0 &&
                  (iVar10 = bcmp((this_00->super_OptionBase<CLI::Option>).group_._M_dataplus._M_p,
                                 (pbVar16->_M_dataplus)._M_p,__n), iVar10 != 0)))) {
                iVar10 = ::std::__cxx11::string::compare((char *)pbVar16);
                if ((iVar10 != 0) ||
                   ((this_00->super_OptionBase<CLI::Option>).group_._M_string_length != 0))
                goto LAB_0010e3e7;
                pbVar21 = (this_00->lnames_).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
              }
              ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &local_368,local_2c8,pbVar21);
              Option::reduced_results_abi_cxx11_((results_t *)local_338,this_00);
              detail::ini_join((string *)&local_318,(results_t *)local_338,local_2c0->arraySeparator
                               ,local_2c0->arrayStart,local_2c0->arrayEnd);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((results_t *)local_338);
              if ((char)local_340 == '\x01' && (char *)local_318._8_8_ == (char *)0x0) {
                pcVar1 = (this_00->default_str_)._M_dataplus._M_p;
                local_338._0_8_ = (pointer)(local_338 + 0x10);
                ::std::__cxx11::string::_M_construct<char*>
                          ((string *)local_338,pcVar1,
                           pcVar1 + (this_00->default_str_)._M_string_length);
                uVar18 = local_338._8_8_;
                if ((pointer)local_338._0_8_ != (pointer)(local_338 + 0x10)) {
                  operator_delete((void *)local_338._0_8_,(ulong)(local_338._16_8_ + 1));
                }
                pbVar16 = local_2f0;
                if ((pointer)uVar18 == (pointer)0x0) {
                  if (this_00->expected_min_ == 0) {
                    ::std::__cxx11::string::_M_replace
                              ((ulong)&local_318,0,(char *)local_318._8_8_,0x1440de);
                  }
                }
                else {
                  pcVar1 = (this_00->default_str_)._M_dataplus._M_p;
                  local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
                  ::std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_2b8,pcVar1,
                             pcVar1 + (this_00->default_str_)._M_string_length);
                  detail::convert_arg_for_ini((string *)local_338,&local_2b8);
                  pbVar16 = local_2f0;
                  ::std::__cxx11::string::operator=
                            ((string *)local_318._M_local_buf,(string *)local_338);
                  if ((pointer)local_338._0_8_ != (pointer)(local_338 + 0x10)) {
                    operator_delete((void *)local_338._0_8_,(ulong)(local_338._16_8_ + 1));
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
                    operator_delete(local_2b8._M_dataplus._M_p,
                                    local_2b8.field_2._M_allocated_capacity + 1);
                  }
                }
              }
              if ((char *)local_318._8_8_ != (char *)0x0) {
                if (((char)local_33c != '\0') && ((this_00->description_)._M_string_length != 0)) {
                  local_338[0] = (string)0xa;
                  ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,local_338,1);
                  poVar11 = ::std::__ostream_insert<char,std::char_traits<char>>
                                      (local_1a8,local_2e8._M_dataplus._M_p,
                                       local_2e8._M_string_length);
                  local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
                  pcVar1 = (this_00->description_)._M_dataplus._M_p;
                  ::std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_228,pcVar1,
                             pcVar1 + (this_00->description_)._M_string_length);
                  detail::fix_newlines((string *)local_338,&local_2e8,&local_228);
                  poVar11 = ::std::__ostream_insert<char,std::char_traits<char>>
                                      (poVar11,(char *)local_338._0_8_,local_338._8_8_);
                  local_2b8._M_dataplus._M_p._0_1_ = 10;
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar11,(char *)&local_2b8,1)
                  ;
                  if ((pointer)local_338._0_8_ != (pointer)(local_338 + 0x10)) {
                    operator_delete((void *)local_338._0_8_,(ulong)(local_338._16_8_ + 1));
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_228._M_dataplus._M_p != &local_228.field_2) {
                    operator_delete(local_228._M_dataplus._M_p,
                                    local_228.field_2._M_allocated_capacity + 1);
                  }
                }
                poVar11 = ::std::__ostream_insert<char,std::char_traits<char>>
                                    (local_1a8,(char *)local_368._M_unused._0_8_,local_368._8_8_);
                local_338[0] = (string)local_2c0->valueDelimiter;
                poVar11 = ::std::__ostream_insert<char,std::char_traits<char>>(poVar11,local_338,1);
                poVar11 = ::std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar11,(char *)local_318._M_allocated_capacity,local_318._8_8_
                                    );
                local_338[0] = (string)0xa;
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar11,local_338,1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_318._M_allocated_capacity != &local_308) {
                operator_delete((void *)local_318._M_allocated_capacity,
                                local_308._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_368._M_unused._0_8_ != &local_358) {
                operator_delete(local_368._M_unused._M_object,local_358._M_allocated_capacity + 1);
              }
            }
LAB_0010e3e7:
            pbVar22 = local_2f0;
            ppOVar5 = local_278.
                      super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
            local_278.super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>.
            _M_impl.super__Vector_impl_data._M_finish = ppOVar7;
          }
          pbVar22 = local_200;
          bVar9 = local_341;
          local_278.super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>.
          _M_impl.super__Vector_impl_data._M_finish = ppOVar5;
          if (local_278.
              super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_278.
                            super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_278.
                                  super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_278.
                                  super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
            pbVar22 = local_200;
            bVar9 = local_341;
          }
        }
      }
      pbVar16 = pbVar16 + 1;
      bVar20 = bVar9;
    } while (pbVar16 != pbVar22);
  }
  local_358._M_allocated_capacity = 0;
  local_358._8_8_ = 0;
  local_368._M_unused._M_object =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x0;
  local_368._8_8_ = 0;
  App::get_subcommands
            ((vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_> *)&local_2b8,local_2f8,
             (function<bool_(const_CLI::App_*)> *)&local_368);
  if ((code *)local_358._M_allocated_capacity != (code *)0x0) {
    (*(code *)local_358._M_allocated_capacity)(&local_368,&local_368,3);
  }
  sVar6 = local_2b8._M_string_length;
  if (local_2b8._M_dataplus._M_p != (pointer)local_2b8._M_string_length) {
    local_340 = local_340 & 0xff;
    local_2f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                (CONCAT44(local_2f0._4_4_,local_33c) & 0xffffffff000000ff);
    _Var17._M_p = local_2b8._M_dataplus._M_p;
    do {
      sVar2 = *(size_type *)_Var17._M_p;
      if (*(long *)(sVar2 + 0x10) == 0) {
        if (((char)local_33c != '\0') && (*(long *)(sVar2 + 0x2d0) != 0)) {
          local_368._M_pod_data[0] = 10;
          poVar11 = ::std::__ostream_insert<char,std::char_traits<char>>
                              (local_1a8,local_368._M_pod_data,1);
          poVar11 = ::std::__ostream_insert<char,std::char_traits<char>>
                              (poVar11,local_2e8._M_dataplus._M_p,local_2e8._M_string_length);
          poVar11 = ::std::__ostream_insert<char,std::char_traits<char>>
                              (poVar11,*(char **)(sVar2 + 0x2c8),*(long *)(sVar2 + 0x2d0));
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar11," Options\n",9);
        }
        pcVar1 = (local_2c8->_M_dataplus)._M_p;
        local_1d8[0] = local_1c8;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)local_1d8,pcVar1,pcVar1 + local_2c8->_M_string_length);
        (**(local_2c0->super_Config)._vptr_Config)
                  (&local_368,local_2c0,sVar2,(ulong)local_340,(ulong)local_2f0 & 0xffffffff,
                   (string *)local_1d8);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  (local_1a8,(char *)local_368._M_unused._0_8_,local_368._8_8_);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_368._M_unused._0_8_ != &local_358) {
          operator_delete(local_368._M_unused._M_object,(ulong)(local_358._M_allocated_capacity + 1)
                         );
        }
        if (local_1d8[0] != local_1c8) {
          operator_delete(local_1d8[0],local_1c8[0] + 1);
        }
      }
      _Var17._M_p = _Var17._M_p + 8;
    } while (_Var17._M_p != (pointer)sVar6);
    if (local_2b8._M_dataplus._M_p != (pointer)local_2b8._M_string_length) {
      _Var17._M_p = local_2b8._M_dataplus._M_p;
      do {
        subcom = *(App **)_Var17._M_p;
        if ((subcom->name_)._M_string_length != 0) {
          if ((subcom->configurable_ == true) &&
             (pAVar12 = App::get_subcommand(local_2f8,subcom), pAVar12->parsed_ != 0)) {
            if ((local_2c8->_M_string_length == 0) && (local_2f8->parent_ != (App *)0x0)) {
              pcVar1 = (local_2f8->name_)._M_dataplus._M_p;
              local_318._M_allocated_capacity = (size_type)&local_308;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_318,pcVar1,pcVar1 + (local_2f8->name_)._M_string_length);
              ::std::__cxx11::string::append(local_318._M_local_buf);
              plVar13 = (long *)::std::__cxx11::string::_M_append
                                          (local_318._M_local_buf,
                                           (ulong)(subcom->name_)._M_dataplus._M_p);
              local_368._M_unused._M_object = &local_358;
              paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(plVar13 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar13 == paVar15) {
                local_358._M_allocated_capacity = paVar15->_M_allocated_capacity;
                local_358._8_8_ = plVar13[3];
              }
              else {
                local_358._M_allocated_capacity = paVar15->_M_allocated_capacity;
                local_368._M_unused._M_object =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)*plVar13;
              }
              local_368._8_8_ = plVar13[1];
              *plVar13 = (long)paVar15;
              plVar13[1] = 0;
              *(undefined1 *)(plVar13 + 2) = 0;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_318._M_allocated_capacity != &local_308) {
                operator_delete((void *)local_318._M_allocated_capacity,
                                local_308._M_allocated_capacity + 1);
              }
              pAVar12 = local_2f8->parent_;
              pAVar3 = pAVar12->parent_;
              while (pAVar3 != (App *)0x0) {
                local_338._0_8_ = local_338 + 0x10;
                pcVar1 = (pAVar12->name_)._M_dataplus._M_p;
                ::std::__cxx11::string::_M_construct<char*>
                          ((string *)local_338,pcVar1,pcVar1 + (pAVar12->name_)._M_string_length);
                ::std::__cxx11::string::append((char *)local_338);
                plVar13 = (long *)::std::__cxx11::string::_M_append
                                            ((char *)local_338,local_368._M_unused._M_member_pointer
                                            );
                paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(plVar13 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar13 == paVar15) {
                  local_308._M_allocated_capacity = paVar15->_M_allocated_capacity;
                  local_308._8_8_ = plVar13[3];
                  local_318._M_allocated_capacity = (size_type)&local_308;
                }
                else {
                  local_308._M_allocated_capacity = paVar15->_M_allocated_capacity;
                  local_318._M_allocated_capacity =
                       (size_type)
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)*plVar13;
                }
                local_318._8_8_ = plVar13[1];
                *plVar13 = (long)paVar15;
                plVar13[1] = 0;
                *(undefined1 *)(plVar13 + 2) = 0;
                ::std::__cxx11::string::operator=
                          ((string *)local_368._M_pod_data,(string *)local_318._M_local_buf);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_318._M_allocated_capacity != &local_308) {
                  operator_delete((void *)local_318._M_allocated_capacity,
                                  local_308._M_allocated_capacity + 1);
                }
                if ((pointer)local_338._0_8_ != (pointer)(local_338 + 0x10)) {
                  operator_delete((void *)local_338._0_8_,(ulong)(local_338._16_8_ + 1));
                }
                pAVar12 = pAVar12->parent_;
                pAVar3 = pAVar12->parent_;
              }
              local_318._M_allocated_capacity._1_7_ =
                   (undefined7)(local_318._M_allocated_capacity >> 8);
              local_318._M_local_buf[0] = 0x5b;
              poVar11 = ::std::__ostream_insert<char,std::char_traits<char>>
                                  (local_1a8,local_318._M_local_buf,1);
              poVar11 = ::std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar11,(char *)local_368._M_unused._0_8_,local_368._8_8_);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar11,"]\n",2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_368._M_unused._0_8_ != &local_358) {
                operator_delete(local_368._M_unused._M_object,
                                (ulong)(local_358._M_allocated_capacity + 1));
              }
            }
            else {
              local_368._M_pod_data[0] = 0x5b;
              poVar11 = ::std::__ostream_insert<char,std::char_traits<char>>
                                  (local_1a8,local_368._M_pod_data,1);
              poVar11 = ::std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar11,(local_2c8->_M_dataplus)._M_p,local_2c8->_M_string_length
                                  );
              poVar11 = ::std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar11,(subcom->name_)._M_dataplus._M_p,
                                   (subcom->name_)._M_string_length);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar11,"]\n",2);
            }
            local_248[0] = &local_238;
            ::std::__cxx11::string::_M_construct<char_const*>((string *)local_248,"");
            (**(local_2c0->super_Config)._vptr_Config)
                      (&local_368,local_2c0,subcom,(ulong)local_340,(ulong)local_2f0 & 0xffffffff,
                       (string *)local_248);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      (local_1a8,(char *)local_368._M_unused._0_8_,local_368._8_8_);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_368._M_unused._0_8_ != &local_358) {
              operator_delete(local_368._M_unused._M_object,
                              (ulong)(local_358._M_allocated_capacity + 1));
            }
            uVar18 = local_238._M_allocated_capacity;
            uVar19 = local_248[0];
            if (local_248[0] != &local_238) {
LAB_0010e822:
              operator_delete((void *)uVar19,uVar18 + 1);
            }
          }
          else {
            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_318,local_2c8,&subcom->name_);
            plVar13 = (long *)::std::__cxx11::string::append(local_318._M_local_buf);
            local_298 = &local_288;
            plVar14 = plVar13 + 2;
            if ((long *)*plVar13 == plVar14) {
              local_288 = *plVar14;
              uStack_280 = (undefined4)plVar13[3];
              uStack_27c = *(undefined4 *)((long)plVar13 + 0x1c);
            }
            else {
              local_288 = *plVar14;
              local_298 = (long *)*plVar13;
            }
            local_290 = plVar13[1];
            *plVar13 = (long)plVar14;
            plVar13[1] = 0;
            *(undefined1 *)(plVar13 + 2) = 0;
            (**(local_2c0->super_Config)._vptr_Config)
                      (&local_368,local_2c0,subcom,(ulong)local_340,(ulong)local_2f0 & 0xffffffff,
                       &local_298);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      (local_1a8,(char *)local_368._M_unused._0_8_,local_368._8_8_);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_368._M_unused._0_8_ != &local_358) {
              operator_delete(local_368._M_unused._M_object,
                              (ulong)(local_358._M_allocated_capacity + 1));
            }
            if (local_298 != &local_288) {
              operator_delete(local_298,local_288 + 1);
            }
            uVar18 = local_308._M_allocated_capacity;
            uVar19 = local_318._M_allocated_capacity;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_318._M_allocated_capacity != &local_308) goto LAB_0010e822;
          }
        }
        _Var17._M_p = _Var17._M_p + 8;
      } while (_Var17._M_p != (pointer)local_2b8._M_string_length);
    }
  }
  psVar8 = local_208;
  ::std::__cxx11::stringbuf::str();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete(local_2b8._M_dataplus._M_p,
                    local_2b8.field_2._M_allocated_capacity - (long)local_2b8._M_dataplus._M_p);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_260);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
    operator_delete(local_2e8._M_dataplus._M_p,
                    CONCAT71(local_2e8.field_2._M_allocated_capacity._1_7_,
                             local_2e8.field_2._M_local_buf[0]) + 1);
  }
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  ::std::ios_base::~ios_base(local_138);
  return psVar8;
}

Assistant:

inline std::string
ConfigBase::to_config(const App *app, bool default_also, bool write_description, std::string prefix) const {
    std::stringstream out;
    std::string commentLead;
    commentLead.push_back(commentChar);
    commentLead.push_back(' ');

    std::vector<std::string> groups = app->get_groups();
    bool defaultUsed = false;
    groups.insert(groups.begin(), std::string("Options"));
    if(write_description) {
        out << commentLead << app->get_description() << '\n';
    }
    for(auto &group : groups) {
        if(group == "Options" || group.empty()) {
            if(defaultUsed) {
                continue;
            }
            defaultUsed = true;
        }
        if(write_description && group != "Options" && !group.empty()) {
            out << '\n' << commentLead << group << " Options\n";
        }
        for(const Option *opt : app->get_options({})) {

            // Only process option with a long-name and configurable
            if(!opt->get_lnames().empty() && opt->get_configurable()) {
                if(opt->get_group() != group) {
                    if(!(group == "Options" && opt->get_group().empty())) {
                        continue;
                    }
                }
                std::string name = prefix + opt->get_lnames()[0];
                std::string value = detail::ini_join(opt->reduced_results(), arraySeparator, arrayStart, arrayEnd);

                if(value.empty() && default_also) {
                    if(!opt->get_default_str().empty()) {
                        value = detail::convert_arg_for_ini(opt->get_default_str());
                    } else if(opt->get_expected_min() == 0) {
                        value = "false";
                    }
                }

                if(!value.empty()) {
                    if(write_description && opt->has_description()) {
                        out << '\n';
                        out << commentLead << detail::fix_newlines(commentLead, opt->get_description()) << '\n';
                    }
                    out << name << valueDelimiter << value << '\n';
                }
            }
        }
    }
    auto subcommands = app->get_subcommands({});
    for(const App *subcom : subcommands) {
        if(subcom->get_name().empty()) {
            if(write_description && !subcom->get_group().empty()) {
                out << '\n' << commentLead << subcom->get_group() << " Options\n";
            }
            out << to_config(subcom, default_also, write_description, prefix);
        }
    }

    for(const App *subcom : subcommands) {
        if(!subcom->get_name().empty()) {
            if(subcom->get_configurable() && app->got_subcommand(subcom)) {
                if(!prefix.empty() || app->get_parent() == nullptr) {
                    out << '[' << prefix << subcom->get_name() << "]\n";
                } else {
                    std::string subname = app->get_name() + "." + subcom->get_name();
                    auto p = app->get_parent();
                    while(p->get_parent() != nullptr) {
                        subname = p->get_name() + "." + subname;
                        p = p->get_parent();
                    }
                    out << '[' << subname << "]\n";
                }
                out << to_config(subcom, default_also, write_description, "");
            } else {
                out << to_config(subcom, default_also, write_description, prefix + subcom->get_name() + ".");
            }
        }
    }

    return out.str();
}